

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex,
          size_t streamLength)

{
  bool bVar1;
  pointer ppVar2;
  _Base_ptr local_48;
  _Self local_38;
  _Self local_30;
  iterator iMap;
  size_t streamLength_local;
  size_t markerIndex_local;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_local;
  
  iMap._M_node = (_Base_ptr)streamLength;
  streamLength_local = markerIndex;
  markerIndex_local = (size_t)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
       ::find(&this->Markers,&streamLength_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
       ::end(&this->Markers);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>
             ::operator->(&local_30);
    this->pThisBlock = ppVar2->second;
    this->ThisPos = streamLength_local - this->pThisBlock->Index;
    if (this->pSourceStream == (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0) {
      local_48 = (_Base_ptr)0x0;
    }
    else {
      local_48 = iMap._M_node;
    }
    this->LengthLeft = (size_t)local_48;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BacktrackingTokenStream<Token>::BacktrackToMarker(size_t markerIndex, size_t streamLength) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;

    pThisBlock = iMap->second;
    ThisPos    = markerIndex - pThisBlock->Index;
    LengthLeft = pSourceStream ? streamLength : 0u;
    return true;
}